

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

int WildMidi_Close(midi *handle)

{
  long *plVar1;
  _hndl *p_Var2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  char *wmfor;
  int wmerno;
  uint lne;
  _hndl *p_Var6;
  ulong uVar7;
  
  if (WM_Initialized == '\0') {
    lne = 0xa37;
    wmerno = 8;
    wmfor = (char *)0x0;
  }
  else {
    if (handle == (midi *)0x0) {
      wmfor = "(NULL handle)";
      lne = 0xa3b;
    }
    else {
      if (first_handle != (_hndl *)0x0) {
        FCriticalSection::Enter((FCriticalSection *)handle);
        p_Var6 = first_handle;
        if (first_handle->handle == handle) {
          p_Var6 = first_handle->next;
          free(first_handle);
          first_handle = p_Var6;
          if (p_Var6 != (_hndl *)0x0) {
            p_Var6->prev = (_hndl *)0x0;
          }
        }
        else {
          do {
            if (p_Var6->handle == handle) goto LAB_003419a3;
            p_Var6 = p_Var6->next;
          } while (p_Var6 != (_hndl *)0x0);
          p_Var6 = (_hndl *)0x0;
LAB_003419a3:
          if (p_Var6 != (_hndl *)0x0) {
            p_Var2 = p_Var6->prev;
            p_Var2->next = p_Var6->next;
            if (p_Var6->next != (_hndl *)0x0) {
              p_Var6->next->prev = p_Var2;
            }
            free(p_Var6);
          }
        }
        if (*(long *)((long)handle + 0x50358) != 0) {
          FCriticalSection::Enter(&patch_lock);
          if (*(long *)((long)handle + 0x50358) != 0) {
            uVar7 = 0;
            do {
              lVar5 = *(long *)(*(long *)((long)handle + 0x50350) + uVar7 * 8);
              plVar1 = (long *)(lVar5 + 0x60);
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                for (; lVar4 = *(long *)(lVar5 + 0x68), lVar4 != 0;
                    lVar5 = *(long *)(lVar5 + uVar7 * 8)) {
                  uVar3 = *(undefined8 *)(lVar4 + 0x68);
                  free(*(void **)(lVar4 + 0x60));
                  free(*(void **)(*(long *)(*(long *)((long)handle + 0x50350) + uVar7 * 8) + 0x68));
                  lVar5 = *(long *)((long)handle + 0x50350);
                  *(undefined8 *)(*(long *)(lVar5 + uVar7 * 8) + 0x68) = uVar3;
                }
                *(undefined1 *)(lVar5 + 2) = 0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < *(ulong *)((long)handle + 0x50358));
          }
          FCriticalSection::Leave(&patch_lock);
          free(*(void **)((long)handle + 0x50350));
        }
        free(*(void **)((long)handle + 0x40));
        _WM_free_reverb(*(_rvb **)((long)handle + 0x50378));
        free(*(void **)((long)handle + 0x50368));
        free(handle);
        return 0;
      }
      wmfor = "(no midi\'s open)";
      lne = 0xa40;
    }
    wmerno = 9;
  }
  _WM_ERROR("WildMidi_Close",lne,wmerno,wmfor,0);
  return -1;
}

Assistant:

WM_SYMBOL int WildMidi_Close(midi * handle) {
	struct _mdi *mdi = (struct _mdi *) handle;
	struct _hndl * tmp_handle;

	if (!WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_NOT_INIT, NULL, 0);
		return -1;
	}
	if (handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(NULL handle)",
				0);
		return -1;
	}
	if (first_handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(no midi's open)",
				0);
		return -1;
	}
	mdi->lock.Enter();
	if (first_handle->handle == handle) {
		tmp_handle = first_handle->next;
		free(first_handle);
		first_handle = tmp_handle;
		if (first_handle)
			first_handle->prev = NULL;
	} else {
		tmp_handle = first_handle;
		while (tmp_handle->handle != handle) {
			tmp_handle = tmp_handle->next;
			if (tmp_handle == NULL) {
				break;
			}
		}
		if (tmp_handle) {
			tmp_handle->prev->next = tmp_handle->next;
			if (tmp_handle->next) {
				tmp_handle->next->prev = tmp_handle->prev;
			}
			free(tmp_handle);
		}
	}

	freeMDI(mdi);

	return 0;
}